

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_DataBlobSourceDestroy(hrgls_DataBlobSource stream)

{
  DataBlobSource *this;
  hrgls_Status hVar1;
  
  if (stream == (hrgls_DataBlobSource)0x0) {
    hVar1 = 0x3ec;
  }
  else {
    this = stream->stream;
    if (this == (DataBlobSource *)0x0) {
      hVar1 = 0x3ec;
    }
    else {
      hrgls::datablob::DataBlobSource::~DataBlobSource(this);
      operator_delete(this);
      stream->stream = (DataBlobSource *)0x0;
      hVar1 = 0;
    }
    std::__cxx11::string::~string((string *)&stream->info);
    operator_delete(stream);
  }
  return hVar1;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceDestroy(hrgls_DataBlobSource stream)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!stream) {
      s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
    } else {
      if (!stream->stream) {
        s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
      } else {
        try {
          delete stream->stream;
        } catch (...) {
          s = hrgls_STATUS_DELETION_FAILED;
        }
        stream->stream = nullptr;
      }
      try {
        delete stream;
      } catch (...) {
        s = hrgls_STATUS_DELETION_FAILED;
      }
    }
    return s;
  }